

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.h
# Opt level: O1

void __thiscall
embree::sse2::CurveGeometryInterface<embree::BSplineCurveT>::interpolate_impl<4>
          (CurveGeometryInterface<embree::BSplineCurveT> *this,RTCInterpolateArguments *args)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  char *pcVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  vector<BufferView<Vec3ff>_> *pvVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  
  uVar5 = args->valueCount;
  pvVar14 = &(this->super_CurveGeometry).vertices;
  if (args->bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
    pvVar14 = (vector<BufferView<Vec3ff>_> *)&(this->super_CurveGeometry).vertexAttribs;
  }
  if ((ulong)uVar5 != 0) {
    pfVar7 = args->P;
    pfVar8 = args->dPdu;
    pfVar9 = args->ddPdudu;
    pcVar10 = pvVar14->items[args->bufferSlot].super_RawBufferView.ptr_ofs;
    uVar16 = (ulong)(uint)pvVar14->items[args->bufferSlot].super_RawBufferView.stride;
    fVar4 = args->u;
    uVar6 = args->primID;
    fVar18 = 1.0 - fVar4;
    fVar25 = fVar4 * fVar4 * fVar4;
    fVar26 = fVar4 * fVar18 * fVar4;
    fVar24 = fVar18 * fVar4 * fVar18;
    fVar31 = fVar18 * fVar18 * fVar18;
    fVar32 = fVar31 * 0.16666667;
    fVar23 = (fVar24 * 12.0 + fVar26 * 6.0 + fVar31 * 4.0 + fVar25) * 0.16666667;
    fVar24 = (fVar26 * 12.0 + fVar24 * 6.0 + fVar25 * 4.0 + fVar31) * 0.16666667;
    fVar25 = fVar25 * 0.16666667;
    fVar26 = fVar4 * fVar18 * 4.0;
    fVar33 = -fVar18 * fVar18 * 0.5;
    fVar31 = (-fVar4 * fVar4 - fVar26) * 0.5;
    fVar34 = (fVar18 * fVar18 + fVar26) * 0.5;
    fVar35 = fVar4 * fVar4 * 0.5;
    fVar36 = fVar4 - (fVar18 + fVar18);
    fVar26 = fVar18 - (fVar4 + fVar4);
    uVar17 = 0;
    do {
      uVar15 = (ulong)*(uint *)(*(long *)&(this->super_CurveGeometry).super_Geometry.field_0x58 +
                               *(long *)&(this->super_CurveGeometry).field_0x68 * (ulong)uVar6);
      uVar44 = (uint)uVar17;
      uVar41 = -(uint)((int)uVar44 < (int)uVar5);
      uVar42 = -(uint)((int)(uVar44 | 1) < (int)uVar5);
      uVar43 = -(uint)((int)(uVar44 | 2) < (int)uVar5);
      uVar44 = -(uint)((int)(uVar44 | 3) < (int)uVar5);
      puVar1 = (uint *)(pcVar10 + uVar17 * 4 + uVar16 * uVar15);
      fVar45 = (float)(*puVar1 & uVar41);
      fVar46 = (float)(puVar1[1] & uVar42);
      fVar47 = (float)(puVar1[2] & uVar43);
      fVar48 = (float)(puVar1[3] & uVar44);
      puVar1 = (uint *)(pcVar10 + uVar17 * 4 + (uVar15 + 1) * uVar16);
      fVar27 = (float)(*puVar1 & uVar41);
      fVar28 = (float)(puVar1[1] & uVar42);
      fVar29 = (float)(puVar1[2] & uVar43);
      fVar30 = (float)(puVar1[3] & uVar44);
      puVar1 = (uint *)(pcVar10 + uVar17 * 4 + (uVar15 + 2) * uVar16);
      fVar19 = (float)(*puVar1 & uVar41);
      fVar20 = (float)(puVar1[1] & uVar42);
      fVar21 = (float)(puVar1[2] & uVar43);
      fVar22 = (float)(puVar1[3] & uVar44);
      puVar1 = (uint *)(pcVar10 + uVar17 * 4 + (uVar15 + 3) * uVar16);
      fVar37 = (float)(*puVar1 & uVar41);
      fVar38 = (float)(puVar1[1] & uVar42);
      fVar39 = (float)(puVar1[2] & uVar43);
      fVar40 = (float)(puVar1[3] & uVar44);
      if (pfVar7 != (float *)0x0) {
        pfVar2 = pfVar7 + uVar17;
        fVar11 = pfVar2[1];
        fVar12 = pfVar2[2];
        fVar13 = pfVar2[3];
        pfVar3 = pfVar7 + uVar17;
        *pfVar3 = (float)((uint)(fVar32 * fVar45 +
                                fVar23 * fVar27 + fVar24 * fVar19 + fVar25 * fVar37) & uVar41 |
                         ~uVar41 & (uint)*pfVar2);
        pfVar3[1] = (float)((uint)(fVar32 * fVar46 +
                                  fVar23 * fVar28 + fVar24 * fVar20 + fVar25 * fVar38) & uVar42 |
                           ~uVar42 & (uint)fVar11);
        pfVar3[2] = (float)((uint)(fVar32 * fVar47 +
                                  fVar23 * fVar29 + fVar24 * fVar21 + fVar25 * fVar39) & uVar43 |
                           ~uVar43 & (uint)fVar12);
        pfVar3[3] = (float)((uint)(fVar32 * fVar48 +
                                  fVar23 * fVar30 + fVar24 * fVar22 + fVar25 * fVar40) & uVar44 |
                           ~uVar44 & (uint)fVar13);
      }
      if (pfVar8 != (float *)0x0) {
        pfVar2 = pfVar8 + uVar17;
        fVar11 = pfVar2[1];
        fVar12 = pfVar2[2];
        fVar13 = pfVar2[3];
        pfVar3 = pfVar8 + uVar17;
        *pfVar3 = (float)((uint)(fVar33 * fVar45 +
                                fVar31 * fVar27 + fVar34 * fVar19 + fVar35 * fVar37) & uVar41 |
                         ~uVar41 & (uint)*pfVar2);
        pfVar3[1] = (float)((uint)(fVar33 * fVar46 +
                                  fVar31 * fVar28 + fVar34 * fVar20 + fVar35 * fVar38) & uVar42 |
                           ~uVar42 & (uint)fVar11);
        pfVar3[2] = (float)((uint)(fVar33 * fVar47 +
                                  fVar31 * fVar29 + fVar34 * fVar21 + fVar35 * fVar39) & uVar43 |
                           ~uVar43 & (uint)fVar12);
        pfVar3[3] = (float)((uint)(fVar33 * fVar48 +
                                  fVar31 * fVar30 + fVar34 * fVar22 + fVar35 * fVar40) & uVar44 |
                           ~uVar44 & (uint)fVar13);
      }
      if (pfVar9 != (float *)0x0) {
        pfVar2 = pfVar9 + uVar17;
        fVar11 = pfVar2[1];
        fVar12 = pfVar2[2];
        fVar13 = pfVar2[3];
        pfVar3 = pfVar9 + uVar17;
        *pfVar3 = (float)(~uVar41 & (uint)*pfVar2 |
                         (uint)(fVar45 * fVar18 + fVar27 * fVar36 + fVar19 * fVar26 + fVar37 * fVar4
                               ) & uVar41);
        pfVar3[1] = (float)(~uVar42 & (uint)fVar11 |
                           (uint)(fVar46 * fVar18 +
                                 fVar28 * fVar36 + fVar20 * fVar26 + fVar38 * fVar4) & uVar42);
        pfVar3[2] = (float)(~uVar43 & (uint)fVar12 |
                           (uint)(fVar47 * fVar18 +
                                 fVar29 * fVar36 + fVar21 * fVar26 + fVar39 * fVar4) & uVar43);
        pfVar3[3] = (float)(~uVar44 & (uint)fVar13 |
                           (uint)(fVar48 * fVar18 +
                                 fVar30 * fVar36 + fVar22 * fVar26 + fVar40 * fVar4) & uVar44);
      }
      uVar17 = uVar17 + 4;
    } while (uVar17 < uVar5);
  }
  return;
}

Assistant:

void interpolate_impl(const RTCInterpolateArguments* const args)
    {
      unsigned int primID = args->primID;
      float u = args->u;
      RTCBufferType bufferType = args->bufferType;
      unsigned int bufferSlot = args->bufferSlot;
      float* P = args->P;
      float* dPdu = args->dPdu;
      float* ddPdudu = args->ddPdudu;
      unsigned int valueCount = args->valueCount;
      
      /* calculate base pointer and stride */
      assert((bufferType == RTC_BUFFER_TYPE_VERTEX && bufferSlot < numTimeSteps) ||
             (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE && bufferSlot <= vertexAttribs.size()));
      const char* src = nullptr; 
      size_t stride = 0;
      if (bufferType == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
        src    = vertexAttribs[bufferSlot].getPtr();
        stride = vertexAttribs[bufferSlot].getStride();
      } else {
        src    = vertices[bufferSlot].getPtr();
        stride = vertices[bufferSlot].getStride();
      }

      for (unsigned int i=0; i<valueCount; i+=N)
      {
        size_t ofs = i*sizeof(float);
        const size_t index = curves[primID];
        const vbool<N> valid = vint<N>((int)i)+vint<N>(step) < vint<N>((int)valueCount);
        const vfloat<N> p0 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+0)*stride+ofs]);
        const vfloat<N> p1 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+1)*stride+ofs]);
        const vfloat<N> p2 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+2)*stride+ofs]);
        const vfloat<N> p3 = mem<vfloat<N>>::loadu(valid,(float*)&src[(index+3)*stride+ofs]);
        
        const Curve<vfloat<N>> curve(p0,p1,p2,p3);
        if (P      ) mem<vfloat<N>>::storeu(valid,P+i,      curve.eval(u));
        if (dPdu   ) mem<vfloat<N>>::storeu(valid,dPdu+i,   curve.eval_du(u));
        if (ddPdudu) mem<vfloat<N>>::storeu(valid,ddPdudu+i,curve.eval_dudu(u));
      }
    }